

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

void png_destroy_write_struct(png_structpp png_ptr_ptr,png_infopp info_ptr_ptr)

{
  png_const_structrp png_ptr;
  
  if ((png_ptr_ptr != (png_structpp)0x0) &&
     (png_ptr = *png_ptr_ptr, png_ptr != (png_const_structrp)0x0)) {
    png_destroy_info_struct(png_ptr,info_ptr_ptr);
    *png_ptr_ptr = (png_struct *)0x0;
    if ((png_ptr->flags & 2) != 0) {
      deflateEnd(&png_ptr->zstream);
    }
    png_free_buffer_list(png_ptr,&png_ptr->zbuffer_list);
    png_free(png_ptr,png_ptr->row_buf);
    png_ptr->row_buf = (png_bytep)0x0;
    png_free(png_ptr,png_ptr->prev_row);
    png_free(png_ptr,png_ptr->try_row);
    png_free(png_ptr,png_ptr->tst_row);
    png_ptr->prev_row = (png_bytep)0x0;
    png_ptr->try_row = (png_bytep)0x0;
    png_ptr->tst_row = (png_bytep)0x0;
    png_free(png_ptr,png_ptr->chunk_list);
    png_ptr->chunk_list = (png_bytep)0x0;
    png_destroy_png_struct(png_ptr);
    return;
  }
  return;
}

Assistant:

void PNGAPI
png_destroy_write_struct(png_structpp png_ptr_ptr, png_infopp info_ptr_ptr)
{
   png_debug(1, "in png_destroy_write_struct");

   if (png_ptr_ptr != NULL)
   {
      png_structrp png_ptr = *png_ptr_ptr;

      if (png_ptr != NULL) /* added in libpng 1.6.0 */
      {
         png_destroy_info_struct(png_ptr, info_ptr_ptr);

         *png_ptr_ptr = NULL;
         png_write_destroy(png_ptr);
         png_destroy_png_struct(png_ptr);
      }
   }
}